

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx512::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,Vec3fa *ofs,float scale,
          float r_scale0,LinearSpace3fa *space,size_t primID,BBox1f *time_range)

{
  float fVar1;
  undefined1 auVar2 [16];
  
  fVar1 = (this->super_LineSegments).super_Geometry.time_range.lower;
  auVar2._0_4_ = (time_range->lower - fVar1) /
                 ((this->super_LineSegments).super_Geometry.time_range.upper - fVar1);
  auVar2._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar2 = vmulss_avx512f(ZEXT416((uint)(this->super_LineSegments).super_Geometry.fnumTimeSegments),
                          auVar2);
  vrndscaless_avx512f(auVar2,auVar2);
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const {
        return linearBounds(ofs,scale,r_scale0,space,primID,time_range);
      }